

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

uint8_t expr_to_any_slot(Parser *psr,Node *node)

{
  Node *node_local;
  Parser *psr_local;
  
  expr_discharge(psr,node);
  if (node->type == NODE_NON_RELOC) {
    psr_local._7_1_ = (node->field_1).slot;
  }
  else {
    psr_local._7_1_ = expr_to_next_slot(psr,node);
  }
  return psr_local._7_1_;
}

Assistant:

static uint8_t expr_to_any_slot(Parser *psr, Node *node) {
	// Only deal with discharged values
	expr_discharge(psr, node);
	switch (node->type) {
	case NODE_NON_RELOC:
		return node->slot;
	default:
		return expr_to_next_slot(psr, node);
	}
}